

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

bool S_ChangeMusic(char *musicname,int order,bool looping,bool force)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  FString *this;
  FName *pFVar6;
  MidiDeviceSetting *device;
  FWadLump *this_00;
  ulong uVar7;
  ulong uVar8;
  MusInfo *pMVar9;
  undefined7 in_register_00000009;
  float rel_vol;
  FString DEH_Music;
  FName local_38;
  FName local_34;
  
  if (((int)CONCAT71(in_register_00000009,force) == 0) && (PlayList != (FPlayList *)0x0)) {
    return false;
  }
  if (musicname == (char *)0x0) goto LAB_00320dba;
  cVar1 = *musicname;
  if (cVar1 == '*') {
    if (musicname[1] == '\0') {
      if (((gamestate != GS_TITLELEVEL) && (gamestate != GS_LEVEL)) ||
         (level.Music.Chars == (char *)0x0)) goto LAB_00320dba;
      cVar1 = *level.Music.Chars;
      musicname = level.Music.Chars;
      order = level.musicorder;
      goto LAB_00320cb5;
    }
  }
  else {
LAB_00320cb5:
    if (cVar1 == '\0') {
LAB_00320dba:
      S_StopMusic(true);
      FString::operator=(&mus_playing.name,(char *)"");
      FString::operator=(&LastSong,(char *)"");
      return true;
    }
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  DEH_Music.Chars = FString::NullString.Nothing;
  if ((*musicname == '$') &&
     (pcVar5 = FStringTable::operator[](&GStrings,musicname + 1), pcVar5 != (char *)0x0)) {
    this = FString::operator+=(&DEH_Music,"D_");
    FString::operator+=(this,pcVar5);
    musicname = DEH_Music.Chars;
  }
  FName::FName(&local_34,musicname);
  pFVar6 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::CheckKey
                     (&MusicAliases,&local_34);
  pMVar9 = mus_playing.handle;
  if (pFVar6 == (FName *)0x0) {
LAB_00320d51:
    if (((mus_playing.handle != (MusInfo *)0x0 && *(int *)(mus_playing.name.Chars + -0xc) != 0) &&
        (iVar3 = strcasecmp(mus_playing.name.Chars,musicname), iVar3 == 0)) &&
       (pMVar9->m_Looping == looping)) {
      if (order == mus_playing.baseorder) {
        iVar3 = (*pMVar9->_vptr_MusInfo[8])(pMVar9);
        pMVar9 = (MusInfo *)0x1;
        if ((char)iVar3 == '\0') {
          (*(mus_playing.handle)->_vptr_MusInfo[4])
                    (mus_playing.handle,(ulong)looping,(ulong)(uint)order);
        }
      }
      else {
        iVar3 = (*pMVar9->_vptr_MusInfo[0xc])(pMVar9,(ulong)(uint)order);
        pMVar9 = (MusInfo *)0x1;
        if ((char)iVar3 != '\0') {
          mus_playing.baseorder = order;
        }
      }
      goto LAB_00321069;
    }
    iVar3 = strncasecmp(musicname,",CD,",4);
    if (iVar3 == 0) {
      iVar3 = 0;
      uVar7 = strtoul(musicname + 4,(char **)0x0,0);
      pcVar5 = strchr(musicname + 4,0x2c);
      if (pcVar5 != (char *)0x0) {
        uVar8 = strtoul(pcVar5 + 1,(char **)0x0,0x10);
        iVar3 = (int)uVar8;
      }
      S_StopMusic(true);
      mus_playing.handle = I_RegisterCDSong((int)uVar7,iVar3);
LAB_00320eff:
      mus_playing.loop = looping;
      FString::operator=(&mus_playing.name,musicname);
      mus_playing.baseorder = 0;
      FString::operator=(&LastSong,(char *)"");
      pMVar9 = mus_playing.handle;
      if (mus_playing.handle != (MusInfo *)0x0) {
        rel_vol = S_GetMusicVolume(musicname);
        MusInfo::Start(pMVar9,looping,rel_vol,order);
        mus_playing.baseorder = order;
        goto LAB_00320f57;
      }
    }
    else {
      FName::FName(&local_38,musicname);
      device = TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
               ::CheckKey(&MidiDevices,&local_38);
      iVar3 = strncmp(musicname,"file://",7);
      if (iVar3 == 0) {
        musicname = musicname + 7;
      }
      bVar2 = FileExists(musicname);
      if (bVar2) {
        this_00 = (FWadLump *)operator_new(0x30);
        FileReader::FileReader((FileReader *)this_00,musicname);
        pMVar9 = (MusInfo *)0x0;
LAB_00320e6f:
        S_StopMusic(true);
        if (snd_musicvolume.Value <= 0.0) {
          mus_playing.loop = looping;
          FString::operator=(&mus_playing.name,musicname);
          mus_playing.baseorder = order;
          FString::operator=(&LastSong,musicname);
          pMVar9 = (MusInfo *)0x1;
          if (this_00 != (FWadLump *)0x0) {
            (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00);
          }
          goto LAB_00321069;
        }
        if (pMVar9 == (MusInfo *)0x0) {
          mus_playing.handle = I_RegisterSong(&this_00->super_FileReader,device);
        }
        else {
          mus_playing.handle = pMVar9;
          if (this_00 != (FWadLump *)0x0) {
            (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00);
          }
        }
        goto LAB_00320eff;
      }
      iVar3 = FWadCollection::CheckNumForFullName(&Wads,musicname,true,0x10);
      if (iVar3 == -1) {
        pcVar5 = strstr(musicname,"://");
        if (musicname < pcVar5) {
          pMVar9 = I_RegisterURLSong(musicname);
          if (pMVar9 != (MusInfo *)0x0) {
            this_00 = (FWadLump *)0x0;
            goto LAB_00320e6f;
          }
          pcVar5 = "Could not open \"%s\"\n";
        }
        else {
          pcVar5 = "Music \"%s\" not found\n";
        }
        pMVar9 = (MusInfo *)0x0;
        Printf(pcVar5,musicname);
        goto LAB_00321069;
      }
      iVar4 = FWadCollection::LumpLength(&Wads,iVar3);
      if (iVar4 != 0) {
        this_00 = FWadCollection::ReopenLumpNumNewFile(&Wads,iVar3);
        pMVar9 = (MusInfo *)0x0;
        if (this_00 == (FWadLump *)0x0) goto LAB_00321069;
        goto LAB_00320e6f;
      }
    }
    pMVar9 = (MusInfo *)0x0;
  }
  else {
    if ((long)pFVar6->Index != 0) {
      musicname = FName::NameData.NameArray[pFVar6->Index].Text;
      goto LAB_00320d51;
    }
LAB_00320f57:
    pMVar9 = (MusInfo *)0x1;
  }
LAB_00321069:
  FString::~FString(&DEH_Music);
  return SUB81(pMVar9,0);
}

Assistant:

bool S_ChangeMusic (const char *musicname, int order, bool looping, bool force)
{
	if (!force && PlayList)
	{ // Don't change if a playlist is active
		return false;
	}

	// allow specifying "*" as a placeholder to play the level's default music.
	if (musicname != NULL && !strcmp(musicname, "*"))
	{
		if (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL)
		{
			musicname = level.Music;
			order = level.musicorder;
		}
		else
		{
			musicname = NULL;
		}
	}

	if (musicname == NULL || musicname[0] == 0)
	{
		// Don't choke if the map doesn't have a song attached
		S_StopMusic (true);
		mus_playing.name = "";
		LastSong = "";
		return true;
	}

	FString DEH_Music;
	if (musicname[0] == '$')
	{
		// handle dehacked replacement.
		// Any music name defined this way needs to be prefixed with 'D_' because
		// Doom.exe does not contain the prefix so these strings don't either.
		const char * mus_string = GStrings[musicname+1];
		if (mus_string != NULL)
		{
			DEH_Music << "D_" << mus_string;
			musicname = DEH_Music;
		}
	}

	FName *aliasp = MusicAliases.CheckKey(musicname);
	if (aliasp != NULL) 
	{
		if (*aliasp == NAME_None)
		{
			return true;	// flagged to be ignored
		}
		musicname = aliasp->GetChars();
	}

	if (!mus_playing.name.IsEmpty() &&
		mus_playing.handle != NULL &&
		stricmp (mus_playing.name, musicname) == 0 &&
		mus_playing.handle->m_Looping == looping)
	{
		if (order != mus_playing.baseorder)
		{
			if (mus_playing.handle->SetSubsong(order))
			{
				mus_playing.baseorder = order;
			}
		}
		else if (!mus_playing.handle->IsPlaying())
		{
			mus_playing.handle->Play(looping, order);
		}
		return true;
	}

	if (strnicmp (musicname, ",CD,", 4) == 0)
	{
		int track = strtoul (musicname+4, NULL, 0);
		const char *more = strchr (musicname+4, ',');
		unsigned int id = 0;

		if (more != NULL)
		{
			id = strtoul (more+1, NULL, 16);
		}
		S_StopMusic (true);
		mus_playing.handle = I_RegisterCDSong (track, id);
	}
	else
	{
		int lumpnum = -1;
		int length = 0;
		MusInfo *handle = NULL;
		MidiDeviceSetting *devp = MidiDevices.CheckKey(musicname);

		// Strip off any leading file:// component.
		if (strncmp(musicname, "file://", 7) == 0)
		{
			musicname += 7;
		}

		FileReader *reader = NULL;
		if (!FileExists (musicname))
		{
			if ((lumpnum = Wads.CheckNumForFullName (musicname, true, ns_music)) == -1)
			{
				if (strstr(musicname, "://") > musicname)
				{
					// Looks like a URL; try it as such.
					handle = I_RegisterURLSong(musicname);
					if (handle == NULL)
					{
						Printf ("Could not open \"%s\"\n", musicname);
						return false;
					}
				}
				else
				{
					Printf ("Music \"%s\" not found\n", musicname);
					return false;
				}
			}
			if (handle == NULL)
			{
				if (Wads.LumpLength (lumpnum) == 0)
				{
					return false;
				}
				reader = Wads.ReopenLumpNumNewFile(lumpnum);
				if (reader == NULL)
				{
					return false;
				}
			}
		}
		else
		{
			// Load an external file.
			reader = new FileReader(musicname);
		}

		// shutdown old music
		S_StopMusic (true);

		// Just record it if volume is 0
		if (snd_musicvolume <= 0)
		{
			mus_playing.loop = looping;
			mus_playing.name = musicname;
			mus_playing.baseorder = order;
			LastSong = musicname;
			delete reader;
			return true;
		}

		// load & register it
		if (handle != NULL)
		{
			mus_playing.handle = handle;
			delete reader;
		}
		else
		{
			mus_playing.handle = I_RegisterSong (reader, devp);
		}
	}

	mus_playing.loop = looping;
	mus_playing.name = musicname;
	mus_playing.baseorder = 0;
	LastSong = "";

	if (mus_playing.handle != 0)
	{ // play it
		mus_playing.handle->Start(looping, S_GetMusicVolume (musicname), order);
		mus_playing.baseorder = order;
		return true;
	}
	return false;
}